

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexParsing.h
# Opt level: O2

string * __thiscall
jaegertracing::utils::HexParsing::readSegment_abi_cxx11_
          (string *__return_storage_ptr__,HexParsing *this,istream *in,size_t maxChars,char delim)

{
  long *plVar1;
  bool bVar2;
  char ch;
  string buffer;
  allocator local_55;
  undefined4 local_54;
  _Alloc_hider local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  local_54 = (undefined4)maxChars;
  local_48 = 0;
  local_40 = '\0';
  local_50._M_p = &local_40;
  do {
    bVar2 = in == (istream *)0x0;
    in = in + -1;
    if (bVar2) {
LAB_001f2a39:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_50._M_p == &local_40) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_38;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
      }
      __return_storage_ptr__->_M_string_length = local_48;
      local_48 = 0;
      local_40 = '\0';
      local_50._M_p = &local_40;
LAB_001f2a78:
      std::__cxx11::string::~string((string *)&local_50);
      return __return_storage_ptr__;
    }
    plVar1 = (long *)std::istream::get((char *)this);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) goto LAB_001f2a39;
    bVar2 = isHex('\0');
    if (!bVar2) {
      if ((char)local_54 != '\0') {
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_55);
        goto LAB_001f2a78;
      }
      std::istream::putback((char)this);
      goto LAB_001f2a39;
    }
    std::__cxx11::string::push_back((char)&local_50);
  } while( true );
}

Assistant:

inline std::string readSegment(std::istream& in, size_t maxChars, char delim)
{
    std::string buffer;
    auto ch = '\0';
    for (auto i = static_cast<size_t>(0); i < maxChars && in.get(ch); ++i) {
        if (!isHex(ch)) {
            if (ch == delim) {
                in.putback(ch);
                break;
            }
            else {
                return "";
            }
        }

        buffer.push_back(ch);
    }
    return buffer;
}